

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O2

void __thiscall helics::FederateError::~FederateError(FederateError *this)

{
  HelicsException::~HelicsException(&this->super_HelicsException);
  operator_delete(this,0x30);
  return;
}

Assistant:

FederateError(int errorCode, std::string_view message) noexcept:
        HelicsException(message), code(errorCode)
    {
    }